

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O2

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  char *pcVar1;
  undefined8 uStackY_30;
  char *pcVar2;
  
  if (handle == &client || handle == &server) {
    if (flags == 0) {
      if (-1 < nread) {
        if (nread == 0) {
          if (addr == (sockaddr *)0x0) {
            return;
          }
          pcVar1 = "==";
          pcVar2 = "==";
          uStackY_30 = 0x4c;
        }
        else {
          if (addr != (sockaddr *)0x0) {
            if (nread == 4) {
              if (*(int *)buf->base == 0x474e4f50) {
                cl_recv_cb_called = cl_recv_cb_called + 1;
                uv_close(handle,close_cb);
                return;
              }
              pcVar1 = "!memcmp(\"PONG\", buf->base, nread)";
              uStackY_30 = 0x52;
            }
            else {
              pcVar1 = "nread == 4";
              uStackY_30 = 0x51;
            }
            goto LAB_00174e83;
          }
          pcVar1 = "!=";
          pcVar2 = "!=";
          addr = (sockaddr *)0x0;
          uStackY_30 = 0x50;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-and-recv.c"
                ,uStackY_30,"addr",pcVar1,"NULL",addr,pcVar2,0);
        abort();
      }
      pcVar1 = "0 && \"unexpected error\"";
      uStackY_30 = 0x47;
    }
    else {
      pcVar1 = "flags == 0";
      uStackY_30 = 0x44;
    }
  }
  else {
    pcVar1 = "(uv_udp_t*)(handle) == &server || (uv_udp_t*)(handle) == &client";
    uStackY_30 = 0x43;
  }
LAB_00174e83:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-and-recv.c"
          ,uStackY_30,pcVar1);
  abort();
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT(flags == 0);

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards cl_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_NOT_NULL(addr);
  ASSERT(nread == 4);
  ASSERT(!memcmp("PING", buf->base, nread));

  cl_recv_cb_called++;

  if (cl_recv_cb_called == 2) {
    /* we are done with the server handle, we can close it */
    uv_close((uv_handle_t*) &server, close_cb);
  } else {
    int r;
    char source_addr[64];

    r = uv_ip6_name((const struct sockaddr_in6*)addr, source_addr, sizeof(source_addr));
    ASSERT(r == 0);

    r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_LEAVE_GROUP);
    ASSERT(r == 0);

    r = uv_udp_set_source_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, source_addr, UV_JOIN_GROUP);
    ASSERT(r == 0);

    r = do_send(&req_ss);
    ASSERT(r == 0);
  }
}